

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O0

char * Amap_LoadFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  int RetValue;
  int nFileSize;
  char *pBuffer;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = (FILE *)Io_FileOpen(pFileName,"open_path","rb",1);
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    if (__stream == (FILE *)0x0) {
      __assert_fail("pFile != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapRead.c"
                    ,0x5b,"char *Amap_LoadFile(char *)");
    }
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    iVar1 = (int)lVar2;
    rewind(__stream);
    pFileName_local = (char *)malloc((long)(iVar1 + 10));
    fread(pFileName_local,(long)iVar1,1,__stream);
    pFileName_local[iVar1] = '\0';
    strcat(pFileName_local,"\n.end\n");
    fclose(__stream);
  }
  return pFileName_local;
}

Assistant:

char * Amap_LoadFile( char * pFileName )
{
//    extern FILE * Io_FileOpen( const char * FileName, const char * PathVar, const char * Mode, int fVerbose );
    FILE * pFile;
    char * pBuffer;
    int nFileSize;
    int RetValue;
    // open the BLIF file for binary reading
    pFile = Io_FileOpen( pFileName, "open_path", "rb", 1 );
//    pFile = fopen( FileName, "rb" );
    // if we got this far, file should be okay otherwise would
    // have been detected by caller
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    assert ( pFile != NULL );
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    // move the file current reading position to the beginning
    rewind( pFile ); 
    // load the contents of the file into memory
    pBuffer = ABC_ALLOC( char, nFileSize + 10 );
    RetValue = fread( pBuffer, nFileSize, 1, pFile );
    // terminate the string with '\0'
    pBuffer[ nFileSize ] = '\0';
    strcat( pBuffer, "\n.end\n" );
    // close file
    fclose( pFile );
    return pBuffer;
}